

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

pool_ptr<soul::AST::ModuleBase> __thiscall
soul::AST::Scope::findSubModuleNamed(Scope *this,Identifier name)

{
  bool bVar1;
  ModuleBase *pMVar2;
  NamespaceAliasDeclaration *pNVar3;
  undefined1 auVar4 [16];
  pool_ptr<soul::AST::Namespace> local_88;
  pool_ref<soul::AST::NamespaceAliasDeclaration> *local_80;
  pool_ref<soul::AST::NamespaceAliasDeclaration> *a;
  pool_ref<soul::AST::NamespaceAliasDeclaration> *__end2_1;
  pool_ref<soul::AST::NamespaceAliasDeclaration> *__begin2_1;
  pool_ref<soul::AST::NamespaceAliasDeclaration> *local_60;
  ArrayView<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>_> *local_58;
  ArrayView<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>_> *__range2_1;
  pool_ref<soul::AST::ModuleBase> *m;
  pool_ref<soul::AST::ModuleBase> *__end2;
  pool_ref<soul::AST::ModuleBase> *__begin2;
  pool_ref<soul::AST::ModuleBase> *local_30;
  ArrayView<soul::pool_ref<soul::AST::ModuleBase>_> *local_28;
  ArrayView<soul::pool_ref<soul::AST::ModuleBase>_> *__range2;
  Scope *this_local;
  Identifier name_local;
  
  __range2 = (ArrayView<soul::pool_ref<soul::AST::ModuleBase>_> *)name.name;
  name_local.name = (string *)this;
  auVar4 = (**(code **)(*(long *)name.name + 0x88))();
  local_30 = auVar4._8_8_;
  __begin2 = auVar4._0_8_;
  local_28 = (ArrayView<soul::pool_ref<soul::AST::ModuleBase>_> *)&__begin2;
  __end2 = ArrayView<soul::pool_ref<soul::AST::ModuleBase>_>::begin(local_28);
  m = ArrayView<soul::pool_ref<soul::AST::ModuleBase>_>::end(local_28);
  for (; __end2 != m; __end2 = __end2 + 1) {
    __range2_1 = (ArrayView<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>_> *)__end2;
    pMVar2 = pool_ref<soul::AST::ModuleBase>::operator->(__end2);
    bVar1 = Identifier::operator==(&pMVar2->name,(Identifier *)&this_local);
    if (bVar1) {
      pMVar2 = pool_ref<soul::AST::ModuleBase>::operator->
                         ((pool_ref<soul::AST::ModuleBase> *)__range2_1);
      bVar1 = ModuleBase::isTemplateModule(pMVar2);
      if (!bVar1) {
        pool_ref::operator_cast_to_pool_ptr((pool_ref *)this);
        return (pool_ptr<soul::AST::ModuleBase>)(ModuleBase *)this;
      }
    }
  }
  auVar4 = (**(code **)(*(long *)name.name + 0x80))();
  local_60 = auVar4._8_8_;
  __begin2_1 = auVar4._0_8_;
  local_58 = (ArrayView<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>_> *)&__begin2_1;
  __end2_1 = ArrayView<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>_>::begin(local_58);
  a = ArrayView<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>_>::end(local_58);
  while( true ) {
    if (__end2_1 == a) {
      pool_ptr<soul::AST::ModuleBase>::pool_ptr((pool_ptr<soul::AST::ModuleBase> *)this);
      return (pool_ptr<soul::AST::ModuleBase>)(ModuleBase *)this;
    }
    local_80 = __end2_1;
    pNVar3 = pool_ref<soul::AST::NamespaceAliasDeclaration>::operator->(__end2_1);
    bVar1 = Identifier::operator==(&pNVar3->name,(Identifier *)&this_local);
    if (bVar1) break;
    __end2_1 = __end2_1 + 1;
  }
  pNVar3 = pool_ref<soul::AST::NamespaceAliasDeclaration>::operator->(local_80);
  local_88.object = (pNVar3->resolvedNamespace).object;
  pool_ptr<soul::AST::ModuleBase>::pool_ptr<soul::AST::Namespace,void>
            ((pool_ptr<soul::AST::ModuleBase> *)this,&local_88);
  pool_ptr<soul::AST::Namespace>::~pool_ptr(&local_88);
  return (pool_ptr<soul::AST::ModuleBase>)(ModuleBase *)this;
}

Assistant:

pool_ptr<ModuleBase> findSubModuleNamed (Identifier name) const
        {
            for (auto& m : getSubModules())
                if (m->name == name && (! m->isTemplateModule()))
                    return m;

            for (auto& a : getNamespaceAliases())
                if (a->name == name)
                    return a->resolvedNamespace;

            return {};
        }